

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ResolveExprNames(NameContext *pNC,Expr *pExpr)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Walker w;
  Walker local_50;
  
  if (pExpr != (Expr *)0x0) {
    uVar3 = pNC->ncFlags;
    pNC->ncFlags = uVar3 & 0xf7ff6fef;
    local_50.pParse = pNC->pParse;
    local_50.xExprCallback = resolveExprStep;
    local_50.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
    if ((uVar3 >> 0x13 & 1) == 0) {
      local_50.xSelectCallback = resolveSelectStep;
    }
    local_50.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
    iVar2 = (local_50.pParse)->nHeight + pExpr->nHeight;
    (local_50.pParse)->nHeight = iVar2;
    local_50.u.pNC = pNC;
    if ((local_50.pParse)->db->aLimit[3] < iVar2) {
      sqlite3ErrorMsg(local_50.pParse,"Expression tree is too large (maximum depth %d)");
      uVar3 = 1;
    }
    else {
      sqlite3WalkExprNN(&local_50,pExpr);
      (local_50.pParse)->nHeight = (local_50.pParse)->nHeight - pExpr->nHeight;
      uVar1 = pNC->ncFlags;
      pExpr->flags = pExpr->flags | uVar1 & 0x8010;
      pNC->ncFlags = uVar3 & 0x8009010 | uVar1;
      uVar3 = 1;
      if (pNC->nNcErr < 1) {
        uVar3 = (uint)(0 < (local_50.pParse)->nErr);
      }
    }
    return uVar3;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3ResolveExprNames(
  NameContext *pNC,       /* Namespace to resolve expressions in. */
  Expr *pExpr             /* The expression to be analyzed. */
){
  int savedHasAgg;
  Walker w;

  if( pExpr==0 ) return SQLITE_OK;
  savedHasAgg = pNC->ncFlags & (NC_HasAgg|NC_MinMaxAgg|NC_HasWin|NC_OrderAgg);
  pNC->ncFlags &= ~(NC_HasAgg|NC_MinMaxAgg|NC_HasWin|NC_OrderAgg);
  w.pParse = pNC->pParse;
  w.xExprCallback = resolveExprStep;
  w.xSelectCallback = (pNC->ncFlags & NC_NoSelect) ? 0 : resolveSelectStep;
  w.xSelectCallback2 = 0;
  w.u.pNC = pNC;
#if SQLITE_MAX_EXPR_DEPTH>0
  w.pParse->nHeight += pExpr->nHeight;
  if( sqlite3ExprCheckHeight(w.pParse, w.pParse->nHeight) ){
    return SQLITE_ERROR;
  }
#endif
  assert( pExpr!=0 );
  sqlite3WalkExprNN(&w, pExpr);
#if SQLITE_MAX_EXPR_DEPTH>0
  w.pParse->nHeight -= pExpr->nHeight;
#endif
  assert( EP_Agg==NC_HasAgg );
  assert( EP_Win==NC_HasWin );
  testcase( pNC->ncFlags & NC_HasAgg );
  testcase( pNC->ncFlags & NC_HasWin );
  ExprSetProperty(pExpr, pNC->ncFlags & (NC_HasAgg|NC_HasWin) );
  pNC->ncFlags |= savedHasAgg;
  return pNC->nNcErr>0 || w.pParse->nErr>0;
}